

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# differentiable.cxx
# Opt level: O1

void __thiscall
DifferentialEquation::DifferentialEquation
          (DifferentialEquation *this,Time *time,double x0,double dx0,string *name,string *type)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  string local_58;
  double local_38;
  double local_30;
  
  local_38 = x0;
  local_30 = dx0;
  StochasticProcess::StochasticProcess((StochasticProcess *)this,time,name,type);
  (this->super_StochasticVariable).super_StochasticProcess.super_Parametric._vptr_Parametric =
       (_func_int **)&PTR__DifferentialEquation_0015c900;
  (this->super_StochasticVariable).super_StochasticProcess.super_TimeDependent._vptr_TimeDependent =
       (_func_int **)&PTR__DifferentialEquation_0015c990;
  (this->super_StochasticVariable).super_StochasticProcess.super_Physical._vptr_Physical =
       (_func_int **)&PTR__DifferentialEquation_0015c9d8;
  (this->eqnIntegrands).
  super__Vector_base<StochasticFunction_*,_std::allocator<StochasticFunction_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->eqnIntegrands).
  super__Vector_base<StochasticFunction_*,_std::allocator<StochasticFunction_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->eqnIntegrands).
  super__Vector_base<StochasticFunction_*,_std::allocator<StochasticFunction_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->eqnIntegrators).
  super__Vector_base<StochasticVariable_*,_std::allocator<StochasticVariable_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->eqnIntegrators).
  super__Vector_base<StochasticVariable_*,_std::allocator<StochasticVariable_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->eqnIntegrators).
  super__Vector_base<StochasticVariable_*,_std::allocator<StochasticVariable_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->eqnX0 = local_38;
  this->eqnTermAmount = 0;
  local_58._M_dataplus._M_p = (pointer)0x0;
  local_58._M_string_length = 0;
  local_58.field_2._M_allocated_capacity = 0;
  std::vector<StochasticFunction_*,_std::allocator<StochasticFunction_*>_>::_M_move_assign
            (&this->eqnIntegrands,&local_58);
  if (local_58._M_dataplus._M_p != (pointer)0x0) {
    operator_delete(local_58._M_dataplus._M_p,
                    local_58.field_2._M_allocated_capacity - (long)local_58._M_dataplus._M_p);
  }
  this->eqnTermAmount = 0;
  local_58._M_dataplus._M_p = (pointer)0x0;
  local_58._M_string_length = 0;
  local_58.field_2._M_allocated_capacity = 0;
  std::vector<StochasticVariable_*,_std::allocator<StochasticVariable_*>_>::_M_move_assign
            (&this->eqnIntegrators,&local_58);
  if (local_58._M_dataplus._M_p != (pointer)0x0) {
    operator_delete(local_58._M_dataplus._M_p,
                    local_58.field_2._M_allocated_capacity - (long)local_58._M_dataplus._M_p);
  }
  this->eqnMethodPtr = (offset_in_DifferentialEquation_to_subr)stepEulerIto;
  *(undefined8 *)&this->field_0x158 = 0;
  (this->super_StochasticVariable).super_StochasticProcess.stochNextValue = local_38;
  (this->super_StochasticVariable).super_StochasticProcess.stochCurrentValue = local_38;
  this->eqnIncrement = local_30;
  paVar1 = &local_58.field_2;
  local_58._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"equation","");
  Parametric::addParameter((Parametric *)this,&local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar1) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  local_58._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"mode","");
  Parametric::addParameter((Parametric *)this,&local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar1) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  local_58._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"starting-value","");
  Parametric::addParameter((Parametric *)this,&local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar1) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

DifferentialEquation::DifferentialEquation(Time *time, double x0, double dx0, const string& name, const string& type)
	: StochasticVariable(time, name, type)
{
	eqnX0 = x0;
	eqnTermAmount = 0;
	eqnIntegrands = vector<StochasticFunction *>();
	eqnTermAmount = 0;
	eqnIntegrators = vector<StochasticVariable *>();
	eqnMethodPtr = &DifferentialEquation::stepEulerIto;
	stochCurrentValue = stochNextValue = x0;
	eqnIncrement = dx0;
	addParameter("equation");
	addParameter("mode");
	addParameter("starting-value");
}